

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildStatementFence(void)

{
  NscSymbolFence *pNVar1;
  CNscPStackEntry *pEntry;
  
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript != true)) {
    pEntry = (CNscPStackEntry *)0x0;
  }
  else {
    pEntry = CNscContext::GetPStackEntryInt(g_pCtx);
    if (pEntry->m_nType != NscType_Unknown) {
      __assert_fail("m_nType == NscType_Unknown",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0xee,"void CNscPStackEntry::SetType(NscType)");
    }
    pEntry->m_nType = NscType_Unknown;
    pNVar1 = g_pCtx->m_pCurrentFence;
    if ((pNVar1 == (NscSymbolFence *)0x0) || (pNVar1->fEatScope != true)) {
      CNscContext::GetFence(g_pCtx,pEntry,0,NscFenceType_Scope,false);
    }
    else {
      pNVar1->fEatScope = false;
    }
  }
  return pEntry;
}

Assistant:

YYSTYPE NscBuildStatementFence ()
{
	CNscPStackEntry *pOut;

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		pOut = NULL;
	}

	//
	// Otherwise, create a new fence
	//

	else
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);

		//
		// A new fence isn't really created unless we are inside a function
		// and if the previous fence isn't marked to eat the next fence.
		// The eat fence is used for constructs such as IF that create their
		// own fence and need the '{}' to not create their's.
		//

		NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
		if (pFence == NULL)
            NscPushFence (pOut, NULL, NscFenceType_Scope, false);
		else
		{
			if (pFence ->fEatScope)
				pFence ->fEatScope = false;
			else
	            NscPushFence (pOut, NULL, NscFenceType_Scope, false);
		}
	}
	return pOut;
}